

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

uint32_t * parasail_reverse_uint32_t(uint32_t *s,size_t length)

{
  size_t _size;
  size_t j;
  size_t i;
  uint32_t *r;
  size_t length_local;
  uint32_t *s_local;
  
  s_local = (uint32_t *)malloc(length << 2);
  if (s_local == (uint32_t *)0x0) {
    fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_reverse_uint32_t",length << 2);
    s_local = (uint32_t *)0x0;
  }
  else {
    _size = length - 1;
    for (j = 0; j < length; j = j + 1) {
      s_local[j] = s[_size];
      _size = _size - 1;
    }
  }
  return s_local;
}

Assistant:

uint32_t* parasail_reverse_uint32_t(const uint32_t *s, size_t length)
{
    uint32_t *r = NULL;
    size_t i = 0;
    size_t j = 0;

    PARASAIL_CALLOC(r, uint32_t, length);
    for (i=0,j=length-1; i<length; ++i,--j) {
        r[i] = s[j];
    }

    return r;
}